

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal_or_null_simplification.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::TryRewriteEqualOrIsNull(duckdb *this,Expression *equal_expr,Expression *and_expr)

{
  pointer puVar1;
  byte bVar2;
  byte bVar3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  int iVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> in_RAX;
  BoundComparisonExpression *pBVar6;
  BoundConjunctionExpression *pBVar7;
  type pEVar8;
  BoundOperatorExpression *pBVar9;
  reference this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte bVar10;
  pointer this_01;
  ExpressionType local_59;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_58;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_50;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_48;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> local_40;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_38;
  
  if (((equal_expr->super_BaseExpression).type == COMPARE_BOUNDARY_START) &&
     ((and_expr->super_BaseExpression).type == CONJUNCTION_AND)) {
    pBVar6 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                       (&equal_expr->super_BaseExpression);
    pBVar7 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                       (&and_expr->super_BaseExpression);
    in_RAX._M_head_impl =
         (Expression *)
         ((long)(pBVar7->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pBVar7->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if ((_Head_base<0UL,_duckdb::Expression_*,_false>)in_RAX._M_head_impl ==
        (_Head_base<0UL,_duckdb::Expression_*,_false>)0x10) {
      local_48 = &pBVar6->left;
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                (local_48);
      in_RAX._M_head_impl =
           unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&pBVar6->right);
      this_01 = (pBVar7->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (pBVar7->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_01 != puVar1) {
        bVar10 = 0;
        local_58._M_head_impl = (Expression *)this;
        local_50 = &pBVar6->right;
        local_40.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)
             (_Head_base<0UL,_duckdb::Expression_*,_false>)in_RAX._M_head_impl;
        bVar3 = 0;
        do {
          pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(this_01);
          if ((pEVar8->super_BaseExpression).type != OPERATOR_IS_NULL) {
LAB_011563e0:
            *(undefined8 *)local_58._M_head_impl = 0;
            return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                   (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   )local_58._M_head_impl;
          }
          pBVar9 = BaseExpression::Cast<duckdb::BoundOperatorExpression>
                             (&pEVar8->super_BaseExpression);
          this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](&pBVar9->children,0);
          pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(this_00);
          in_RAX._M_head_impl._0_4_ =
               (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[10])(pEVar8);
          in_RAX._M_head_impl._4_4_ = extraout_var;
          bVar2 = 1;
          if ((char)(int)in_RAX._M_head_impl == '\0') {
            iVar5 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[10])(pEVar8);
            in_RAX._M_head_impl = (Expression *)CONCAT44(extraout_var_00,iVar5);
            bVar10 = 1;
            bVar2 = bVar3;
            if ((char)iVar5 == '\0') goto LAB_011563e0;
          }
          _Var4._M_head_impl = local_58._M_head_impl;
          this_01 = this_01 + 1;
          bVar3 = bVar2;
        } while (this_01 != puVar1);
        this = (duckdb *)local_58._M_head_impl;
        if ((bool)(bVar2 & bVar10)) {
          local_59 = COMPARE_BOUNDARY_END;
          make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((duckdb *)&local_38,&local_59,local_48,local_50);
          ((_Var4._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
               (_func_int **)
               local_38._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 local_38._M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        }
      }
    }
  }
  (((Expression *)this)->super_BaseExpression)._vptr_BaseExpression = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         in_RAX._M_head_impl;
}

Assistant:

static unique_ptr<Expression> TryRewriteEqualOrIsNull(Expression &equal_expr, Expression &and_expr) {
	if (equal_expr.GetExpressionType() != ExpressionType::COMPARE_EQUAL ||
	    and_expr.GetExpressionType() != ExpressionType::CONJUNCTION_AND) {
		return nullptr;
	}

	auto &equal_cast = equal_expr.Cast<BoundComparisonExpression>();
	auto &and_cast = and_expr.Cast<BoundConjunctionExpression>();

	if (and_cast.children.size() != 2) {
		return nullptr;
	}

	// Make sure on the AND conjunction the relevant conditions appear
	auto &a_exp = *equal_cast.left;
	auto &b_exp = *equal_cast.right;
	bool a_is_null_found = false;
	bool b_is_null_found = false;

	for (const auto &item : and_cast.children) {
		auto &next_exp = *item;

		if (next_exp.GetExpressionType() == ExpressionType::OPERATOR_IS_NULL) {
			auto &next_exp_cast = next_exp.Cast<BoundOperatorExpression>();
			auto &child = *next_exp_cast.children[0];

			// Test for equality on both 'a' and 'b' expressions
			if (Expression::Equals(child, a_exp)) {
				a_is_null_found = true;
			} else if (Expression::Equals(child, b_exp)) {
				b_is_null_found = true;
			} else {
				return nullptr;
			}
		} else {
			return nullptr;
		}
	}
	if (a_is_null_found && b_is_null_found) {
		return make_uniq<BoundComparisonExpression>(ExpressionType::COMPARE_NOT_DISTINCT_FROM,
		                                            std::move(equal_cast.left), std::move(equal_cast.right));
	}
	return nullptr;
}